

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_init_image(sg_image img_id,sg_image_desc *desc)

{
  _sg_image_t *img_00;
  _sg_image_t *img;
  sg_image_desc desc_def;
  sg_image_desc *desc_local;
  sg_image img_id_local;
  
  desc_def._1680_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e06,"void sg_init_image(sg_image, const sg_image_desc *)");
  }
  _sg_image_desc_defaults((sg_image_desc *)&img,desc);
  img_00 = _sg_lookup_image(&_sg.pools,img_id.id);
  if (img_00 != (_sg_image_t *)0x0) {
    if ((img_00->slot).state == SG_RESOURCESTATE_ALLOC) {
      _sg_init_image(img_00,(sg_image_desc *)&img);
      if (((img_00->slot).state != SG_RESOURCESTATE_VALID) &&
         ((img_00->slot).state != SG_RESOURCESTATE_FAILED)) {
        __assert_fail("(img->slot.state == SG_RESOURCESTATE_VALID) || (img->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                      ,0x3e0c,"void sg_init_image(sg_image, const sg_image_desc *)");
      }
    }
    else {
      _sg_log("sg_init_image: image must be in alloc state\n");
    }
  }
  return;
}

Assistant:

inline void sg_init_image(sg_image img_id, const sg_image_desc& desc) { return sg_init_image(img_id, &desc); }